

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O0

void __thiscall
MemorySSADumper::dumpDDIMap(MemorySSADumper *this,DefinitionsMap<dg::dda::RWNode> *map)

{
  bool bVar1;
  reference ppRVar2;
  Dumper *in_RSI;
  DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *in_RDI;
  RWNode *where;
  iterator __end3;
  iterator __begin3;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *__range3
  ;
  pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>
  *it2;
  const_iterator __end2;
  const_iterator __begin2;
  DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *__range2;
  value_type *it;
  const_iterator __end1;
  const_iterator __begin1;
  DefinitionsMap<dg::dda::RWNode> *__range1;
  RWNode *in_stack_ffffffffffffff90;
  _Self local_68;
  _Self local_60;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *local_58
  ;
  reference local_50;
  _Self local_48;
  _Self local_40;
  DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *local_38;
  reference local_30;
  _Node_iterator_base<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false>
  local_28;
  _Node_iterator_base<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false>
  local_20;
  Dumper *this_00;
  
  this_00 = in_RSI;
  local_20._M_cur =
       (__node_type *)
       dg::dda::DefinitionsMap<dg::dda::RWNode>::begin((DefinitionsMap<dg::dda::RWNode> *)in_RDI);
  local_28._M_cur =
       (__node_type *)
       dg::dda::DefinitionsMap<dg::dda::RWNode>::end((DefinitionsMap<dg::dda::RWNode> *)in_RDI);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    local_30 = std::__detail::
               _Node_const_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
               ::operator*((_Node_const_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
                            *)0x177b41);
    local_38 = &local_30->second;
    local_40._M_node =
         (_Base_ptr)dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::begin(in_RDI);
    local_48._M_node =
         (_Base_ptr)dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::end(in_RDI);
    while( true ) {
      bVar1 = std::operator!=(&local_40,&local_48);
      if (!bVar1) break;
      local_50 = std::
                 _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                              *)0x177b94);
      printf("<tr><td align=\"left\" colspan=\"4\">");
      Dumper::printName(this_00,(RWNode *)in_RSI);
      printf("</td></tr>");
      local_58 = &local_50->second;
      local_60._M_node =
           (_Base_ptr)
           std::
           set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
           ::begin((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                    *)in_RDI);
      local_68._M_node =
           (_Base_ptr)
           std::
           set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
           ::end((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                  *)in_RDI);
      while( true ) {
        bVar1 = std::operator!=(&local_60,&local_68);
        if (!bVar1) break;
        ppRVar2 = std::_Rb_tree_const_iterator<dg::dda::RWNode_*>::operator*
                            ((_Rb_tree_const_iterator<dg::dda::RWNode_*> *)0x177c11);
        in_stack_ffffffffffffff90 = *ppRVar2;
        printf("<tr><td>&nbsp;&nbsp;</td><td>");
        printInterval<dg::ADT::DiscreteInterval<dg::Offset>const>
                  ((DiscreteInterval<dg::Offset> *)in_stack_ffffffffffffff90,(char *)in_RDI,
                   (char *)0x177c38);
        printf("</td><td>@</td><td>");
        Dumper::printName(this_00,(RWNode *)in_RSI);
        puts("</td></tr>");
        std::_Rb_tree_const_iterator<dg::dda::RWNode_*>::operator++
                  ((_Rb_tree_const_iterator<dg::dda::RWNode_*> *)in_stack_ffffffffffffff90);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                    *)in_stack_ffffffffffffff90);
    }
    std::__detail::
    _Node_const_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
    ::operator++((_Node_const_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
                  *)in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

void dumpDDIMap(const DefinitionsMap<RWNode> &map) {
        for (const auto &it : map) {
            for (const auto &it2 : it.second) {
                printf(R"(<tr><td align="left" colspan="4">)");
                printName(it.first);
                printf("</td></tr>");
                for (auto *where : it2.second) {
                    printf("<tr><td>&nbsp;&nbsp;</td><td>");
                    printInterval(it2.first);
                    printf("</td><td>@</td><td>");
                    printName(where);
                    puts("</td></tr>");
                }
            }
        }
    }